

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_rb_uninit(ma_pcm_rb *pRB)

{
  ma_data_source *in_RDI;
  
  if (in_RDI != (ma_data_source *)0x0) {
    ma_data_source_uninit(in_RDI);
    ma_rb_uninit((ma_rb *)0x22ff54);
  }
  return;
}

Assistant:

MA_API void ma_pcm_rb_uninit(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return;
    }

    ma_data_source_uninit(&pRB->ds);
    ma_rb_uninit(&pRB->rb);
}